

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O0

void FinalAction(cmMakefile *makefile,string *filename,bool append)

{
  size_t *psVar1;
  cmTargetLinkLibraryType cVar2;
  byte bVar3;
  bool bVar4;
  TargetType TVar5;
  cmGeneratedFileStream *this;
  pointer this_00;
  cmake *this_01;
  cmGlobalGenerator *this_02;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *this_03;
  reference this_04;
  pointer this_05;
  cmTargetMap *this_06;
  reference ppVar6;
  cmTarget *this_07;
  string *psVar7;
  LinkLibraryVectorType *this_08;
  reference a;
  mapped_type *pmVar8;
  ostream *poVar9;
  ulong uVar10;
  reference ppVar11;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_2;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_1;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  char *vertest;
  string *ltEntry;
  string local_290;
  cmValue local_270;
  cmValue outname;
  cmTarget *libtgt;
  string lib;
  string ltValue;
  string ltVar;
  LibraryID *li;
  const_iterator __end3;
  const_iterator __begin3;
  LinkLibraryVectorType *__range3;
  LinkLibraryVectorType *libs;
  string valueNew;
  string valueOld;
  string targetEntry;
  cmTarget *target;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *tgt;
  iterator __end2;
  iterator __begin2;
  cmTargetMap *__range2;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *local;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *locals;
  cmGlobalGenerator *global;
  cmake *cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  type local_60;
  ostream *fout;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> ap;
  undefined8 local_40;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_38;
  undefined4 local_2c;
  openmode openmodeApp;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  foutPtr;
  bool append_local;
  string *filename_local;
  cmMakefile *makefile_local;
  
  foutPtr._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl.
  _7_1_ = append;
  std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::
  unique_ptr<std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
             &stack0xffffffffffffffd8);
  if ((foutPtr._M_t.
       super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl._7_1_ & 1) == 0) {
    this = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this,filename,true,None);
    std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
    unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
              ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)&fout
               ,this);
    this_00 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
              operator->((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          *)&fout);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
    std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::operator=
              ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
               &stack0xffffffffffffffd8,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               &fout);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               &fout);
  }
  else {
    local_2c = 1;
    local_40 = std::__cxx11::string::c_str();
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode_const&>
              ((char **)&local_38,(_Ios_Openmode *)&local_40);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::operator=((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffd8,&local_38);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr(&local_38);
  }
  local_60 = std::
             unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          *)&stack0xffffffffffffffd8);
  bVar3 = std::ios::operator!((ios *)((long)&(local_60->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream +
                                     (long)(local_60->
                                           super_basic_ostream<char,_std::char_traits<char>_>).
                                           _vptr_basic_ostream[-3]));
  if ((bVar3 & 1) == 0) {
    this_01 = cmMakefile::GetCMakeInstance(makefile);
    this_02 = cmake::GetGlobalGenerator(this_01);
    this_03 = cmGlobalGenerator::GetMakefiles(this_02);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&__range1);
    __end1 = std::
             vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ::begin(this_03);
    local = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
            std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::end(this_03);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                                       *)&local), bVar4) {
      this_04 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                ::operator*(&__end1);
      this_05 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_04);
      this_06 = cmMakefile::GetTargets_abi_cxx11_(this_05);
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
               ::begin(this_06);
      tgt = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
               ::end(this_06);
      while (bVar4 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                  *)&tgt), bVar4) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator*(&__end2);
        this_07 = &ppVar6->second;
        TVar5 = cmTarget::GetType(this_07);
        if ((0 < (int)TVar5) && (TVar5 = cmTarget::GetType(this_07), (int)TVar5 < 4)) {
          psVar7 = cmTarget::GetName_abi_cxx11_(this_07);
          cmStrCat<std::__cxx11::string_const&,char_const(&)[13]>
                    ((string *)((long)&valueOld.field_2 + 8),psVar7,(char (*) [13])"_LIB_DEPENDS");
          std::__cxx11::string::string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&libs);
          this_08 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this_07);
          __end3 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                   ::begin(this_08);
          li = (LibraryID *)
               std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
               ::end(this_08);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                                             *)&li), bVar4) {
            a = __gnu_cxx::
                __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                ::operator*(&__end3);
            cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>
                      ((string *)((long)&ltValue.field_2 + 8),&a->first,(char (*) [11])"_LINK_TYPE")
            ;
            std::__cxx11::string::string((string *)(lib.field_2._M_local_buf + 8));
            cVar2 = a->second;
            if (cVar2 == GENERAL_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"general;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"general");
            }
            else if (cVar2 == DEBUG_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"debug;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"debug");
            }
            else if (cVar2 == OPTIMIZED_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"optimized;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"optimized");
            }
            std::__cxx11::string::string((string *)&libtgt,(string *)a);
            psVar7 = (string *)cmGlobalGenerator::FindTarget(this_02,(string *)&libtgt,false);
            outname.Value = psVar7;
            if (psVar7 != (string *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_290,"OUTPUT_NAME",(allocator<char> *)((long)&ltEntry + 7))
              ;
              local_270 = cmTarget::GetProperty((cmTarget *)psVar7,&local_290);
              std::__cxx11::string::~string((string *)&local_290);
              std::allocator<char>::~allocator((allocator<char> *)((long)&ltEntry + 7));
              bVar4 = cmValue::operator_cast_to_bool(&local_270);
              if (bVar4) {
                psVar7 = cmValue::operator*[abi_cxx11_(&local_270);
                std::__cxx11::string::operator=((string *)&libtgt,(string *)psVar7);
              }
            }
            std::__cxx11::string::operator+=
                      ((string *)(valueNew.field_2._M_local_buf + 8),(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)(valueNew.field_2._M_local_buf + 8),";");
            std::__cxx11::string::operator+=((string *)&libs,(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)&libs,";");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&__range1,(key_type *)((long)&ltValue.field_2 + 8));
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              bVar4 = std::operator!=(pmVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&lib.field_2 + 8));
              if (bVar4) {
                std::__cxx11::string::operator=((string *)pmVar8,"general");
              }
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)pmVar8,(string *)(lib.field_2._M_local_buf + 8));
            }
            std::__cxx11::string::~string((string *)&libtgt);
            std::__cxx11::string::~string((string *)(lib.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(ltValue.field_2._M_local_buf + 8));
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
            ::operator++(&__end3);
          }
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&libs);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)pmVar8,(string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&libs);
          std::__cxx11::string::~string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(valueOld.field_2._M_local_buf + 8));
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
      ::operator++(&__end1);
    }
    std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                    "# Generated by CMake\n\n");
    poVar9 = std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,"if(");
    poVar9 = std::operator<<(poVar9,"\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4")
    ;
    std::operator<<(poVar9,")\n");
    std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.6 and above.\n");
    psVar1 = &libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar1);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)psVar1);
    while (bVar4 = std::operator!=(&__end1_1,(_Self *)&i), bVar4) {
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_1);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        poVar9 = std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "  set(\"");
        poVar9 = std::operator<<(poVar9,(string *)ppVar11);
        poVar9 = std::operator<<(poVar9,"\" \"");
        poVar9 = std::operator<<(poVar9,(string *)&ppVar11->second);
        std::operator<<(poVar9,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_1);
    }
    std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,"else()\n");
    std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.4 and lower.\n");
    psVar1 = &libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar1);
    i_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)psVar1);
    while (bVar4 = std::operator!=(&__end1_2,(_Self *)&i_1), bVar4) {
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_2);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        poVar9 = std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "  set(\"");
        poVar9 = std::operator<<(poVar9,(string *)ppVar11);
        poVar9 = std::operator<<(poVar9,"\" \"");
        poVar9 = std::operator<<(poVar9,(string *)&ppVar11->second);
        std::operator<<(poVar9,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_2);
    }
    __end1_3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range1);
    i_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range1);
    while (bVar4 = std::operator!=(&__end1_3,(_Self *)&i_2), bVar4) {
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_3);
      bVar4 = std::operator!=(&ppVar11->second,"general");
      if (bVar4) {
        poVar9 = std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "  set(\"");
        poVar9 = std::operator<<(poVar9,(string *)ppVar11);
        poVar9 = std::operator<<(poVar9,"\" \"");
        poVar9 = std::operator<<(poVar9,(string *)&ppVar11->second);
        std::operator<<(poVar9,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_3);
    }
    std::operator<<(&local_60->super_basic_ostream<char,_std::char_traits<char>_>,"endif()\n");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    std::operator+(&local_80,"Error Writing ",filename);
    cmSystemTools::Error(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    cmSystemTools::ReportLastSystemError("");
  }
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

static void FinalAction(cmMakefile& makefile, std::string const& filename,
                        bool append)
{
  // Use copy-if-different if not appending.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (append) {
    const auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(filename.c_str(), openmodeApp);
  } else {
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(filename, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing " + filename);
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = makefile.GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const auto& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (const auto& local : locals) {
    for (auto const& tgt : local->GetTargets()) {
      // Get the current target.
      cmTarget const& target = tgt.second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = cmStrCat(target.GetName(), "_LIB_DEPENDS");

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LibraryID const& li : libs) {
        std::string ltVar = cmStrCat(li.first, "_LINK_TYPE");
        std::string ltValue;
        switch (li.second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li.first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (cmValue outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = *outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (auto const& i : libDepsNew) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (auto const& i : libDepsOld) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  for (auto const& i : libTypes) {
    if (i.second != "general") {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "endif()\n";
}